

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgConvexHull3d.cpp
# Opt level: O3

HaI32 __thiscall dgConvexHull3d::BuildNormalList(dgConvexHull3d *this,dgBigVector *normalArray)

{
  dgTemplateVector<float> local_a8;
  dgTemplateVector<float> local_98;
  HaI32 start;
  HaI32 count;
  dgTemplateVector<float> local_78;
  dgTemplateVector<float> local_68;
  dgTemplateVector<float> local_58;
  dgTemplateVector<float> local_48;
  
  local_98 = SUB6416(ZEXT464(0x3f800000),0);
  local_a8 = SUB6416(ZEXT464(0xbf800000),0);
  local_58.m_x = 0.0;
  local_58.m_y = 1.0;
  local_58.m_z = 0.0;
  local_58.m_w = 0.0;
  local_68.m_x = 0.0;
  local_68.m_y = -1.0;
  local_68.m_z = 0.0;
  local_68.m_w = 0.0;
  local_78.m_x = 0.0;
  local_78.m_y = 0.0;
  local_78.m_z = 1.0;
  local_78.m_w = 0.0;
  count = 0;
  start = 0;
  local_48.m_x = 0.0;
  local_48.m_y = 0.0;
  local_48.m_z = -1.0;
  local_48.m_w = 0.0;
  TessellateTriangle(this,1,(dgVector *)&local_78,(dgVector *)&local_98,(dgVector *)&local_58,&count
                     ,normalArray,&start);
  start = 1;
  TessellateTriangle(this,1,(dgVector *)&local_48,(dgVector *)&local_68,(dgVector *)&local_a8,&count
                     ,normalArray,&start);
  start = 2;
  TessellateTriangle(this,1,(dgVector *)&local_48,(dgVector *)&local_a8,(dgVector *)&local_58,&count
                     ,normalArray,&start);
  start = 3;
  TessellateTriangle(this,1,(dgVector *)&local_78,(dgVector *)&local_68,(dgVector *)&local_98,&count
                     ,normalArray,&start);
  start = 4;
  TessellateTriangle(this,1,(dgVector *)&local_78,(dgVector *)&local_58,(dgVector *)&local_a8,&count
                     ,normalArray,&start);
  start = 5;
  TessellateTriangle(this,1,(dgVector *)&local_48,(dgVector *)&local_98,(dgVector *)&local_68,&count
                     ,normalArray,&start);
  start = 6;
  TessellateTriangle(this,1,(dgVector *)&local_48,(dgVector *)&local_58,(dgVector *)&local_98,&count
                     ,normalArray,&start);
  start = 7;
  TessellateTriangle(this,1,(dgVector *)&local_78,(dgVector *)&local_a8,(dgVector *)&local_68,&count
                     ,normalArray,&start);
  return count;
}

Assistant:

hacd::HaI32 dgConvexHull3d::BuildNormalList (dgBigVector* const normalArray) const
{
	dgVector p0 ( hacd::HaF32 (1.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f)); 
	dgVector p1 (-hacd::HaF32 (1.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f)); 
	dgVector p2 ( hacd::HaF32 (0.0f), hacd::HaF32 (1.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f)); 
	dgVector p3 ( hacd::HaF32 (0.0f),-hacd::HaF32 (1.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f));
	dgVector p4 ( hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (1.0f), hacd::HaF32 (0.0f));
	dgVector p5 ( hacd::HaF32 (0.0f), hacd::HaF32 (0.0f),-hacd::HaF32 (1.0f), hacd::HaF32 (0.0f));

	hacd::HaI32 count = 0;
	hacd::HaI32 subdivitions = 1;

	hacd::HaI32 start = 0;
	TessellateTriangle  (subdivitions, p4, p0, p2, count, normalArray, start);
	start = 1;
	TessellateTriangle  (subdivitions, p5, p3, p1, count, normalArray, start);
	start = 2;
	TessellateTriangle  (subdivitions, p5, p1, p2, count, normalArray, start);
	start = 3;
	TessellateTriangle  (subdivitions, p4, p3, p0, count, normalArray, start);
	start = 4;
	TessellateTriangle  (subdivitions, p4, p2, p1, count, normalArray, start);
	start = 5;
	TessellateTriangle  (subdivitions, p5, p0, p3, count, normalArray, start);
	start = 6;
	TessellateTriangle  (subdivitions, p5, p2, p0, count, normalArray, start);
	start = 7;
	TessellateTriangle  (subdivitions, p4, p1, p3, count, normalArray, start);
	return count;
}